

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v64 c_v64_shr_s16(c_v64 a,uint n)

{
  c_v64 extraout_RAX;
  undefined1 auVar1 [16];
  undefined1 in_ZMM0 [64];
  
  auVar1 = in_ZMM0._0_16_;
  if (n < 0x10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a.u64;
    auVar1 = vpmovsxwd_avx(auVar1);
    auVar1 = vpsrad_avx(auVar1,ZEXT416(n));
    auVar1 = vpackssdw_avx(auVar1,auVar1);
    return (c_v64)auVar1._0_8_;
  }
  c_v64_shr_s16();
  vpsraw_avx(auVar1,ZEXT416(n));
  return (c_v64)extraout_RAX.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: undefined s16 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.s16[c] = a.s16[c] >> n;
  return t;
}